

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Shop::printMedicine(Shop *this,int i)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference pvVar4;
  string *psVar5;
  undefined1 local_a8 [8];
  Medicine medicine;
  int i_local;
  Shop *this_local;
  
  medicine._140_4_ = i;
  poVar3 = std::operator<<((ostream *)&std::cout,"ID");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::operator<<(poVar3,"Name");
  poVar3 = std::operator<<(poVar3,"\t\t");
  poVar3 = std::operator<<(poVar3,"Company Name");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::operator<<(poVar3,"Unit Price");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::operator<<(poVar3,"In Stock");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::operator<<(poVar3,"Quantity");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::operator<<(poVar3,"Arrival Date");
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::operator<<(poVar3,"Expire Date");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pvVar4 = std::vector<Medicine,_std::allocator<Medicine>_>::operator[]
                     (&this->medicineList,(long)(int)medicine._140_4_);
  Medicine::Medicine((Medicine *)local_a8,pvVar4);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,medicine._140_4_ + 1);
  poVar3 = std::operator<<(poVar3,"\t");
  psVar5 = Medicine::getName_abi_cxx11_((Medicine *)local_a8);
  poVar3 = std::operator<<(poVar3,(string *)psVar5);
  poVar3 = std::operator<<(poVar3,"\t");
  psVar5 = Medicine::getCompanyName_abi_cxx11_((Medicine *)local_a8);
  poVar3 = std::operator<<(poVar3,(string *)psVar5);
  poVar3 = std::operator<<(poVar3,"\t    ");
  iVar2 = Medicine::getUnitePrice((Medicine *)local_a8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  poVar3 = std::operator<<(poVar3,"\t\t   ");
  bVar1 = Medicine::getIsStock((Medicine *)local_a8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar1);
  poVar3 = std::operator<<(poVar3,"\t\t  ");
  iVar2 = Medicine::getQuantity((Medicine *)local_a8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  poVar3 = std::operator<<(poVar3,"\t\t  ");
  psVar5 = Medicine::getArrivalDate_abi_cxx11_((Medicine *)local_a8);
  poVar3 = std::operator<<(poVar3,(string *)psVar5);
  poVar3 = std::operator<<(poVar3,"\t");
  psVar5 = Medicine::getExpireDate_abi_cxx11_((Medicine *)local_a8);
  poVar3 = std::operator<<(poVar3,(string *)psVar5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Medicine::~Medicine((Medicine *)local_a8);
  return;
}

Assistant:

void printMedicine(int i) {
        cout << "ID" << "\t" << "Name" << "\t\t" << "Company Name" << "\t" << "Unit Price" << "\t" << "In Stock" << "\t"
             << "Quantity" << "\t" << "Arrival Date" << "\t" << "Expire Date" << endl;
        Medicine medicine = medicineList[i];
        cout << i + 1 << "\t" << medicine.getName() << "\t" << medicine.getCompanyName() << "\t    "
             << medicine.getUnitePrice() << "\t\t   " << medicine.getIsStock() << "\t\t  " << medicine.getQuantity()
             << "\t\t  " << medicine.getArrivalDate() << "\t" << medicine.getExpireDate() << endl;
    }